

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

void slang::ast::TypeParameterSymbol::fromSyntax
               (Scope *scope,TypeParameterDeclarationSyntax *syntax,bool isLocal,bool isPort,
               SmallVectorBase<slang::ast::TypeParameterSymbol_*> *results)

{
  undefined1 *puVar1;
  Compilation *this;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  long lVar4;
  DiagCode code;
  ulong uVar5;
  ForwardTypeRestriction typeRestriction;
  SourceLocation loc;
  TypeParameterSymbol *param;
  string_view name;
  bool local_66;
  bool local_65;
  ForwardTypeRestriction local_64;
  SourceLocation local_60;
  TypeParameterDeclarationSyntax *local_58;
  SmallVectorBase<slang::ast::TypeParameterSymbol_*> *local_50;
  TypeParameterSymbol *local_48;
  string_view local_40;
  
  this = scope->compilation;
  local_64 = None;
  local_66 = isPort;
  local_65 = isLocal;
  local_58 = syntax;
  local_50 = results;
  if (syntax->typeRestriction != (ForwardTypeRestrictionSyntax *)0x0) {
    local_64 = SemanticFacts::getTypeRestriction(syntax->typeRestriction);
  }
  uVar5 = (local_58->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar5) {
    uVar5 = uVar5 >> 1;
    lVar4 = 0;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((local_58->declarators).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar4));
      pSVar2 = *ppSVar3;
      local_40 = parsing::Token::valueText((Token *)(pSVar2 + 1));
      local_60 = parsing::Token::location((Token *)(pSVar2 + 1));
      local_48 = BumpAllocator::
                 emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool&,bool&,slang::ast::ForwardTypeRestriction&>
                           (&this->super_BumpAllocator,scope,&local_40,&local_60,&local_65,&local_66
                            ,&local_64);
      (local_48->super_Symbol).originatingSyntax = pSVar2;
      if (pSVar2[1].previewNode == (SyntaxNode *)0x0) {
        (local_48->targetType).type = this->errorType;
        if (local_66 == false) {
          code.subsystem = Declarations;
          code.code = 0xe;
        }
        else {
          if (local_65 != true) goto LAB_0026ddba;
          code.subsystem = Declarations;
          code.code = 0x6a;
        }
        Scope::addDiag(scope,code,local_60);
      }
      else {
        (local_48->targetType).typeOrLink =
             (anon_union_8_2_f12d5f64_for_typeOrLink)pSVar2[1].previewNode[1].previewNode;
        puVar1 = &(local_48->targetType).field_0x3f;
        *puVar1 = *puVar1 & 0x7f;
      }
LAB_0026ddba:
      SmallVectorBase<slang::ast::TypeParameterSymbol*>::
      emplace_back<slang::ast::TypeParameterSymbol*const&>
                ((SmallVectorBase<slang::ast::TypeParameterSymbol*> *)local_50,&local_48);
      lVar4 = lVar4 + 0x30;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void TypeParameterSymbol::fromSyntax(const Scope& scope,
                                     const TypeParameterDeclarationSyntax& syntax, bool isLocal,
                                     bool isPort, SmallVectorBase<TypeParameterSymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto typeRestriction = ForwardTypeRestriction::None;
    if (syntax.typeRestriction)
        typeRestriction = SemanticFacts::getTypeRestriction(*syntax.typeRestriction);

    for (auto decl : syntax.declarators) {
        auto name = decl->name.valueText();
        auto loc = decl->name.location();

        auto param = comp.emplace<TypeParameterSymbol>(scope, name, loc, isLocal, isPort,
                                                       typeRestriction);
        param->setSyntax(*decl);

        if (!decl->assignment) {
            param->targetType.setType(comp.getErrorType());
            if (!isPort)
                scope.addDiag(diag::BodyParamNoInitializer, loc);
            else if (isLocal)
                scope.addDiag(diag::LocalParamNoInitializer, loc);
        }
        else {
            param->targetType.setTypeSyntax(*decl->assignment->type);
        }

        results.push_back(param);
    }
}